

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_grail_common_sort(int **arr,int Len,int **extbuf,int LExtBuf)

{
  int **ppiVar1;
  int **arr_00;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int M;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int **ppiVar14;
  long lVar15;
  int **ppiVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int **ppiVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  uint L;
  int iVar24;
  int iVar25;
  int **ppiVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int L2;
  int **ppiVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  int *piVar34;
  int iVar35;
  size_t size;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  bool bVar43;
  uint local_c8;
  uint local_c4;
  ulong local_b0;
  
  if (Len < 0x11) {
    stable_bitonic_sort(arr,(long)Len);
    return;
  }
  uVar5 = 1;
  do {
    uVar4 = uVar5;
    uVar12 = (ulong)uVar4;
    uVar5 = uVar4 * 2;
  } while ((int)(uVar4 * uVar4) < Len);
  iVar27 = (Len + -1) / (int)uVar4;
  uVar17 = iVar27 + uVar4 + 1;
  uVar5 = iVar27 + 1;
  iVar27 = 1;
  iVar40 = 0;
  uVar38 = 1;
  lVar22 = 8;
  while ((uVar38 < (uint)Len && (iVar27 < (int)uVar17))) {
    iVar6 = stable_grail_bin_search_left(arr + iVar40,iVar27,(int **)(lVar22 + (long)arr));
    if ((iVar27 - iVar6 == 0) || (*arr[uVar38] != *arr[iVar6 + iVar40])) {
      stable_grail_rotate(arr + iVar40,iVar27,(int)uVar38 - (iVar40 + iVar27));
      iVar40 = (int)uVar38 - iVar27;
      stable_grail_rotate(arr + (iVar6 + iVar40),iVar27 - iVar6,1);
      iVar27 = iVar27 + 1;
    }
    uVar38 = uVar38 + 1;
    lVar22 = lVar22 + 8;
  }
  stable_grail_rotate(arr,iVar40,iVar27);
  if (iVar27 < (int)uVar17) {
    uVar38 = uVar12;
    if (iVar27 < 4) {
      for (uVar12 = 1; uVar12 < (uint)Len; uVar12 = uVar12 + 2) {
        piVar34 = arr[uVar12 - 1];
        if (*arr[uVar12] < *piVar34) {
          arr[uVar12 - 1] = arr[uVar12];
          arr[uVar12] = piVar34;
        }
      }
      uVar12 = 2;
      while (iVar27 = (int)uVar12, iVar27 < Len) {
        uVar5 = iVar27 * 2;
        lVar42 = 0;
        ppiVar16 = arr;
        iVar40 = Len;
        for (lVar22 = 0; lVar22 <= Len + iVar27 * -2; lVar22 = lVar22 + (int)uVar5) {
          stable_grail_merge_without_buffer(ppiVar16,iVar27,iVar27);
          lVar42 = lVar42 + (uVar12 << 0x21);
          iVar40 = iVar40 + iVar27 * -2;
          ppiVar16 = ppiVar16 + (int)uVar5;
        }
        uVar12 = (ulong)uVar5;
        if (iVar40 - iVar27 != 0 && iVar27 <= iVar40) {
          stable_grail_merge_without_buffer
                    ((int **)((lVar42 >> 0x1d) + (long)arr),iVar27,iVar40 - iVar27);
        }
      }
      return;
    }
    do {
      uVar12 = uVar38;
      uVar5 = (uint)uVar12;
      local_c4 = uVar5 >> 1;
      uVar38 = (ulong)local_c4;
    } while (iVar27 < (int)uVar5);
    size = (size_t)(int)uVar5;
    L = Len - uVar5;
    stable_grail_build_blocks(arr + size,L,uVar5,(int **)0x0,0);
    local_b0 = 0;
    local_c8 = uVar5;
  }
  else {
    size = (size_t)(int)uVar17;
    L = Len - uVar17;
    stable_grail_build_blocks(arr + size,L,uVar4,extbuf,LExtBuf);
    local_c4 = uVar5 >> 1;
    local_c8 = uVar17;
    local_b0 = uVar12;
  }
LAB_0010a7cf:
  iVar40 = (int)uVar12;
  uVar4 = iVar40 * 2;
  if (L == uVar4 || SBORROW4(L,uVar4) != (int)(L + iVar40 * -2) < 0) {
    stable_bitonic_sort(arr,size);
    stable_grail_merge_without_buffer(arr,local_c8,L);
    return;
  }
  uVar12 = local_b0;
  if ((iVar27 < (int)uVar17) &&
     (((int)uVar5 < 5 || (uVar12 = (ulong)local_c4, (int)((uVar5 >> 3) * uVar5) < (int)uVar4)))) {
    iVar6 = 1;
    for (lVar22 = (long)(int)uVar4 * (long)iVar27 >> 1; (iVar6 < (int)uVar5 && (lVar22 != 0));
        lVar22 = lVar22 / 8) {
      iVar6 = iVar6 * 2;
    }
    uVar12 = (long)(iVar40 << 2) / (long)iVar6 & 0xffffffff;
    bVar3 = true;
    ppiVar16 = (int **)0x0;
  }
  else {
    bVar3 = false;
    ppiVar16 = extbuf;
    if (LExtBuf < (int)uVar12) {
      ppiVar16 = (int **)0x0;
    }
  }
  iVar40 = iVar40 * 4;
  iVar21 = (int)L % iVar40;
  uVar38 = (long)(int)L / (long)iVar40 & 0xffffffff;
  iVar25 = iVar21;
  iVar6 = 0;
  if ((int)uVar4 < iVar21) {
    iVar25 = 0;
    iVar6 = iVar21;
  }
  iVar21 = (int)uVar12;
  lVar22 = (long)iVar21;
  if (ppiVar16 != (int **)0x0) {
    memcpy(ppiVar16,arr + (size - lVar22),lVar22 * 8);
  }
  M = -iVar21;
  iVar24 = (int)((long)(int)L / (long)iVar40);
  if (iVar24 < 0) {
    iVar24 = -1;
  }
  iVar11 = 0;
  for (uVar31 = 0; (uVar31 != (long)iVar24 + 1U && ((iVar6 != 0 || (uVar31 != uVar38))));
      uVar31 = uVar31 + 1) {
    lVar42 = (long)iVar11;
    ppiVar20 = arr + size + lVar22 + lVar42 + -1;
    ppiVar30 = arr + size + lVar22 + M + lVar42;
    ppiVar14 = arr + size + lVar22 + lVar42 + -1;
    ppiVar26 = arr + size + lVar22 + M + lVar42;
    lVar42 = lVar42 + size + lVar22;
    arr_00 = arr + size + (long)(iVar40 * (int)uVar31);
    iVar41 = iVar40;
    if (uVar31 == uVar38) {
      iVar41 = iVar6;
    }
    iVar28 = (int)((long)iVar41 / (long)iVar21);
    stable_bitonic_sort(arr,(long)(int)((uint)(uVar31 == uVar38) + iVar28));
    uVar7 = (int)uVar4 / iVar21;
    for (uVar36 = 1; (long)uVar36 < (long)iVar28; uVar36 = uVar36 + 1) {
      uVar33 = uVar36 - 1;
      uVar39 = uVar33 & 0xffffffff;
      lVar13 = lVar42;
      uVar19 = uVar36;
      while( true ) {
        uVar18 = (uint)uVar39;
        if ((long)iVar28 <= (long)uVar19) break;
        if ((*arr[lVar13] < *arr_00[(int)(uVar18 * iVar21)]) ||
           ((*arr_00[(int)(uVar18 * iVar21)] == *arr[lVar13] && (*arr[uVar19] < *arr[(int)uVar18])))
           ) {
          uVar39 = uVar19 & 0xffffffff;
        }
        uVar19 = uVar19 + 1;
        lVar13 = lVar13 + lVar22;
      }
      if (uVar33 != uVar39) {
        stable_grail_swap_n(arr_00 + uVar33 * lVar22,arr_00 + (int)(uVar18 * iVar21),iVar21);
        piVar34 = arr[uVar36 - 1];
        arr[uVar36 - 1] = arr[(int)uVar18];
        arr[(int)uVar18] = piVar34;
        if ((uVar33 == uVar7) || (uVar7 == uVar18)) {
          uVar7 = uVar7 ^ (uint)uVar33 ^ uVar18;
        }
      }
      lVar42 = lVar42 + lVar22;
    }
    L2 = 0;
    bVar43 = true;
    if (uVar31 == uVar38) {
      iVar29 = 0;
      if (iVar6 % iVar21 != 0) {
        uVar36 = 0;
        if (0 < iVar28) {
          uVar36 = (long)iVar41 / (long)iVar21 & 0xffffffff;
        }
        iVar41 = (iVar28 + -1) * iVar21;
        uVar18 = 0xffffffff;
        uVar33 = uVar36;
        do {
          bVar43 = uVar33 == 0;
          uVar33 = uVar33 - 1;
          if (bVar43) goto LAB_0010abc1;
          lVar42 = (long)iVar41;
          uVar18 = uVar18 + 1;
          iVar41 = iVar41 - iVar21;
        } while (*arr_00[iVar28 * iVar21] < *arr_00[lVar42]);
        uVar36 = (ulong)uVar18;
LAB_0010abc1:
        iVar29 = (int)uVar36;
        bVar43 = false;
        L2 = iVar6 % iVar21;
      }
    }
    else {
      iVar29 = 0;
    }
    if (ppiVar16 == (int **)0x0) {
      if (iVar28 - iVar29 == 0) {
        iVar28 = iVar28 * iVar21;
      }
      else {
        uVar18 = (uint)(*arr[(int)uVar7] <= **arr);
        lVar42 = 1;
        uVar36 = uVar12;
        uVar33 = uVar12;
        while( true ) {
          iVar8 = (int)uVar36;
          iVar35 = (int)uVar33;
          iVar41 = iVar8 - iVar35;
          if (iVar28 - iVar29 <= lVar42) break;
          uVar19 = uVar12;
          uVar32 = uVar18;
          if (uVar18 == *arr[(int)uVar7] <= *arr[lVar42]) {
            if (!bVar3) {
              stable_grail_swap_n(arr_00 + iVar41 + -lVar22,arr_00 + iVar41,iVar35);
            }
          }
          else {
            ppiVar14 = arr_00 + iVar41;
            if (bVar3) {
              uVar19 = uVar33;
              if (((iVar21 != 0) &&
                  (uVar9 = 1 - uVar18, uVar19 = uVar12, uVar32 = uVar9, iVar35 != 0)) &&
                 (uVar36 = uVar12,
                 -1 < (int)((*ppiVar14[(long)iVar35 + -1] + (uVar18 - 1)) - *ppiVar14[iVar35]))) {
                while( true ) {
                  iVar35 = (int)uVar33;
                  lVar13 = (long)iVar35;
                  iVar41 = (int)uVar36;
                  if (uVar18 == 1) {
                    iVar10 = stable_grail_bin_search_right(ppiVar14 + lVar13,iVar41,ppiVar14);
                  }
                  else {
                    iVar10 = stable_grail_bin_search_left(ppiVar14 + lVar13,iVar41,ppiVar14);
                  }
                  if (iVar10 != 0) {
                    stable_grail_rotate(ppiVar14,iVar35,iVar10);
                    ppiVar14 = ppiVar14 + iVar10;
                    uVar36 = (ulong)(uint)(iVar41 - iVar10);
                  }
                  uVar19 = uVar33;
                  uVar32 = uVar18;
                  if ((int)uVar36 == 0) break;
                  lVar23 = 0;
                  ppiVar26 = ppiVar14;
                  do {
                    uVar19 = uVar36;
                    uVar32 = uVar9;
                    if (lVar13 + -1 == lVar23) goto LAB_0010b0e0;
                    ppiVar1 = ppiVar26 + 1;
                    ppiVar26 = ppiVar26 + 1;
                    lVar23 = lVar23 + 1;
                  } while ((int)((**ppiVar1 + (uVar18 - 1)) - *ppiVar14[lVar13]) < 0);
                  uVar33 = (ulong)(uint)(iVar35 - (int)lVar23);
                  ppiVar14 = ppiVar26;
                }
              }
            }
            else {
              lVar13 = (long)iVar35;
              iVar41 = iVar35 + iVar21;
              ppiVar26 = ppiVar30 + -lVar13;
              iVar10 = 0;
              while( true ) {
                lVar23 = (long)iVar10;
                iVar37 = (int)uVar33;
                if ((iVar35 <= iVar10) || (iVar41 <= iVar37)) break;
                piVar34 = ppiVar14[lVar23];
                if ((int)((*piVar34 + (uVar18 - 1)) - *ppiVar14[iVar37]) < 0) {
                  iVar10 = iVar10 + 1;
                }
                else {
                  uVar33 = (ulong)(iVar37 + 1);
                  piVar34 = ppiVar14[iVar37];
                  lVar23 = (long)iVar37;
                }
                piVar2 = *ppiVar26;
                *ppiVar26 = piVar34;
                ppiVar14[lVar23] = piVar2;
                ppiVar26 = ppiVar26 + 1;
              }
              if (iVar35 - iVar10 == 0 || iVar35 < iVar10) {
                uVar19 = (ulong)(uint)(iVar41 - iVar37);
                uVar32 = 1 - uVar18;
              }
              else {
                ppiVar14 = ppiVar20;
                for (lVar15 = lVar13; uVar19 = (ulong)(uint)(iVar35 - iVar10), lVar23 < lVar15;
                    lVar15 = lVar15 + -1) {
                  piVar34 = *ppiVar14;
                  *ppiVar14 = ppiVar14[iVar41 - lVar13];
                  ppiVar14[iVar41 - lVar13] = piVar34;
                  ppiVar14 = ppiVar14 + -1;
                }
              }
            }
          }
LAB_0010b0e0:
          uVar18 = uVar32;
          lVar42 = lVar42 + 1;
          uVar36 = (ulong)(uint)(iVar8 + iVar21);
          ppiVar30 = ppiVar30 + lVar22;
          ppiVar20 = ppiVar20 + lVar22;
          uVar33 = uVar19;
        }
        if (bVar43) {
          if (!bVar3) {
            stable_grail_swap_n(arr_00 + iVar41,arr_00 + (iVar41 - iVar21),iVar35);
          }
          goto LAB_0010b218;
        }
        if (uVar18 == 0) {
          iVar28 = iVar35 + iVar29 * iVar21;
        }
        else {
          if (!bVar3) {
            stable_grail_swap_n(arr_00 + iVar41 + -lVar22,arr_00 + iVar41,iVar35);
          }
          iVar28 = iVar29 * iVar21;
          iVar41 = iVar8;
        }
        arr_00 = arr_00 + iVar41;
      }
      if (bVar3) {
        stable_grail_merge_without_buffer(arr_00,iVar28,L2);
      }
      else {
        stable_grail_merge_left(arr_00,iVar28,L2,M);
      }
    }
    else if (iVar28 - iVar29 == 0) {
      stable_grail_merge_left_with_x_buf(arr_00,iVar28 * iVar21,L2,M);
    }
    else {
      uVar18 = (uint)(*arr[(int)uVar7] <= **arr);
      lVar42 = 1;
      uVar36 = uVar12;
      uVar33 = uVar12;
      while( true ) {
        iVar35 = (int)uVar33;
        iVar8 = (int)uVar36;
        iVar41 = iVar35 - iVar8;
        lVar13 = (long)iVar8;
        if (iVar28 - iVar29 <= lVar42) break;
        ppiVar20 = arr_00 + iVar41;
        if (uVar18 == *arr[(int)uVar7] <= *arr[lVar42]) {
          memcpy(ppiVar20 + -lVar22,ppiVar20,(long)iVar8 << 3);
          uVar36 = uVar12;
        }
        else {
          iVar41 = iVar8 + iVar21;
          ppiVar30 = ppiVar26 + -lVar13;
          uVar32 = 0;
          while( true ) {
            iVar10 = (int)uVar36;
            if ((iVar8 <= (int)uVar32) || (iVar41 <= iVar10)) break;
            iVar37 = (*ppiVar20[uVar32] + (uVar18 - 1)) - *ppiVar20[iVar10];
            piVar34 = ppiVar20[uVar32];
            if (-1 < iVar37) {
              piVar34 = ppiVar20[iVar10];
            }
            uVar32 = uVar32 - (iVar37 >> 0x1f);
            uVar36 = (ulong)(iVar10 + (uint)(-1 < iVar37));
            *ppiVar30 = piVar34;
            ppiVar30 = ppiVar30 + 1;
          }
          uVar9 = iVar8 - uVar32;
          if (uVar9 == 0 || iVar8 < (int)uVar32) {
            uVar18 = 1 - uVar18;
            uVar9 = iVar41 - iVar10;
          }
          else {
            ppiVar20 = ppiVar14;
            for (lVar23 = lVar13; (long)(ulong)uVar32 < lVar23; lVar23 = lVar23 + -1) {
              ppiVar20[iVar41 - lVar13] = *ppiVar20;
              ppiVar20 = ppiVar20 + -1;
            }
          }
          uVar36 = (ulong)uVar9;
        }
        lVar42 = lVar42 + 1;
        uVar33 = (ulong)(uint)(iVar35 + iVar21);
        ppiVar26 = ppiVar26 + lVar22;
        ppiVar14 = ppiVar14 + lVar22;
      }
      if (bVar43) {
        memcpy(arr_00 + iVar41 + -lVar22,arr_00 + iVar41,lVar13 << 3);
      }
      else {
        if (uVar18 == 0) {
          iVar29 = iVar8 + iVar29 * iVar21;
        }
        else {
          memcpy(arr_00 + iVar41 + -lVar22,arr_00 + iVar41,lVar13 << 3);
          iVar29 = iVar29 * iVar21;
          iVar41 = iVar35;
        }
        stable_grail_merge_left_with_x_buf(arr_00 + iVar41,iVar29,L2,M);
      }
    }
LAB_0010b218:
    iVar11 = iVar11 + iVar40;
  }
  if (ppiVar16 == (int **)0x0) goto LAB_0010b2b9;
  lVar42 = (long)(int)(L - iVar25);
  ppiVar20 = arr + size + lVar42 + -1;
  for (; 0 < lVar42; lVar42 = lVar42 + -1) {
    *ppiVar20 = arr[size + ((lVar42 + -1) - lVar22)];
    ppiVar20 = ppiVar20 + -1;
  }
  memcpy(arr + (size - lVar22),ppiVar16,lVar22 * 8);
  goto LAB_0010b2ae;
LAB_0010b2b9:
  uVar12 = (ulong)uVar4;
  uVar38 = (ulong)(L - iVar25);
  if (!bVar3) {
    ppiVar16 = arr + size + (uVar38 - 1);
    for (; 0 < (int)uVar38; uVar38 = (ulong)((int)uVar38 - 1)) {
      piVar34 = *ppiVar16;
      *ppiVar16 = ppiVar16[-lVar22];
      ppiVar16[-lVar22] = piVar34;
      ppiVar16 = ppiVar16 + -1;
    }
LAB_0010b2ae:
    uVar12 = (ulong)uVar4;
  }
  goto LAB_0010a7cf;
}

Assistant:

static void GRAIL_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                              int LExtBuf) {
  int lblock, nkeys, findkeys, ptr, cbuf, lb, nk;
  int havebuf, chavebuf;
  long long s;

  if (Len <= SMALL_SORT_BND) {
    SMALL_SORT(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  nkeys = (Len - 1) / lblock + 1;
  findkeys = GRAIL_FIND_KEYS(arr, Len, nkeys + lblock);
  havebuf = 1;

  if (findkeys < nkeys + lblock) {
    if (findkeys < 4) {
      GRAIL_LAZY_STABLE_SORT(arr, Len);
      return;
    }

    nkeys = lblock;

    while (nkeys > findkeys) {
      nkeys /= 2;
    }

    havebuf = 0;
    lblock = 0;
  }

  ptr = lblock + nkeys;
  cbuf = havebuf ? lblock : nkeys;

  if (havebuf) {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, extbuf, LExtBuf);
  } else {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, NULL, 0);
  }

  /* 2*cbuf are built */
  while (Len - ptr > (cbuf *= 2)) {
    lb = lblock;
    chavebuf = havebuf;

    if (!havebuf) {
      if (nkeys > 4 && nkeys / 8 * nkeys >= cbuf) {
        lb = nkeys / 2;
        chavebuf = 1;
      } else {
        nk = 1;
        s = (long long)cbuf * findkeys / 2;

        while (nk < nkeys && s != 0) {
          nk *= 2;
          s /= 8;
        }

        lb = (2 * cbuf) / nk;
      }
    }

    GRAIL_COMBINE_BLOCKS(arr, arr + ptr, Len - ptr, cbuf, lb, chavebuf,
                         chavebuf && lb <= LExtBuf ? extbuf : NULL);
  }

  SMALL_SORT(arr, ptr);
  GRAIL_MERGE_WITHOUT_BUFFER(arr, ptr, Len - ptr);
}